

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                        ImGuiWindowClass *window_class)

{
  ImVec2 IVar1;
  ImGuiWindow *this;
  ImGuiWindow_conflict *pIVar2;
  ImGuiWindow_conflict *pIVar3;
  undefined8 uVar4;
  ImGuiContext_conflict1 *ctx;
  ImGuiContext_conflict1 *pIVar5;
  bool bVar6;
  uint uVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  ImGuiContext_conflict1 *g_1;
  ImGuiDockNode *this_00;
  ImGuiDockNode *node;
  ImGuiContext_conflict1 *g;
  uint uVar10;
  int iVar11;
  int iVar12;
  ImVec2 size;
  char title [256];
  ImVec2 local_148;
  ImVec2 *local_140;
  ImGuiDockNode local_138;
  
  ctx = GImGui;
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  this->WriteAccessed = true;
  IVar9 = 0;
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    if (((uint)flags >> 10 & 1) != 0) {
      __assert_fail("(flags & ImGuiDockNodeFlags_DockSpace) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x3bf0,
                    "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    local_140 = size_arg;
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x3bf1,
                    "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    uVar10 = (uint)this->SkipItems | flags;
    this_00 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,id);
    if (this_00 == (ImGuiDockNode *)0x0) {
      this_00 = DockContextAddNode(ctx,id);
      this_00->LocalFlags = 0x800;
      this_00->MergedFlags = this_00->SharedFlags | this_00->LocalFlagsInWindows | 0x800;
    }
    this_00->SharedFlags = uVar10;
    if (window_class == (ImGuiWindowClass *)0x0) {
      local_138.MergedFlags._0_1_ = 0;
      local_138._17_8_ = 0;
      local_138.ID = 0;
      local_138.SharedFlags = 0;
      local_138.LocalFlags._0_1_ = 0;
      local_138._9_7_ = 0;
      bVar6 = true;
    }
    else {
      local_138.ID = window_class->ClassId;
      local_138.SharedFlags = window_class->ParentViewportId;
      uVar4._0_4_ = window_class->ViewportFlagsOverrideSet;
      uVar4._4_4_ = window_class->ViewportFlagsOverrideClear;
      local_138._17_8_ = *(undefined8 *)((long)&window_class->TabItemFlagsOverrideSet + 1);
      local_138.MergedFlags._0_1_ =
           (undefined1)
           ((ulong)*(undefined8 *)((long)&window_class->ViewportFlagsOverrideSet + 1) >> 0x38);
      local_138.LocalFlags._0_1_ = (undefined1)(undefined4)uVar4;
      local_138._9_7_ = SUB87((ulong)uVar4 >> 8,0);
      bVar6 = window_class->DockingAllowUnclassed;
    }
    *(ulong *)((long)&(this_00->WindowClass).ViewportFlagsOverrideSet + 1) =
         CONCAT17((undefined1)local_138.MergedFlags,local_138._9_7_);
    *(undefined8 *)((long)&(this_00->WindowClass).TabItemFlagsOverrideSet + 1) = local_138._17_8_;
    (this_00->WindowClass).ClassId = local_138.ID;
    (this_00->WindowClass).ParentViewportId = local_138.SharedFlags;
    (this_00->WindowClass).ViewportFlagsOverrideSet =
         (int)CONCAT71(local_138._9_7_,(undefined1)local_138.LocalFlags);
    (this_00->WindowClass).ViewportFlagsOverrideClear = local_138.LocalFlagsInWindows;
    (this_00->WindowClass).DockingAllowUnclassed = bVar6;
    iVar11 = ctx->FrameCount;
    IVar9 = id;
    if (((uVar10 & 1) == 0) && (this_00->LastFrameActive == iVar11)) {
      if ((this_00->MergedFlags & 0x400) != 0) {
        __assert_fail("node->IsDockSpace() == false && \"Cannot call DockSpace() twice a frame with the same ID\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x3c02,
                      "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                     );
      }
      uVar7 = this_00->LocalFlags | 0x400;
      this_00->LocalFlags = uVar7;
      this_00->MergedFlags = uVar10 | this_00->LocalFlagsInWindows | uVar7;
    }
    else {
      uVar7 = this_00->LocalFlags | 0x400;
      this_00->LocalFlags = uVar7;
      this_00->MergedFlags = uVar10 | this_00->LocalFlagsInWindows | uVar7;
      pIVar5 = GImGui;
      if ((uVar10 & 1) == 0) {
        pIVar2 = GImGui->CurrentWindow;
        IVar1 = (pIVar2->ContentRegionRect).Max;
        if (((pIVar2->DC).CurrentColumns != (ImGuiOldColumns *)0x0) ||
           (GImGui->CurrentTable != (ImGuiTable *)0x0)) {
          IVar1.y = IVar1.y;
          IVar1.x = (pIVar2->WorkRect).Max.x;
        }
        iVar11 = (int)(*local_140).x;
        iVar12 = (int)(*local_140).y;
        local_148.x = (float)iVar11;
        local_148.y = (float)iVar12;
        if ((iVar11 < 1) &&
           (local_148.x = (IVar1.x - (pIVar2->DC).CursorPos.x) + local_148.x, local_148.x <= 4.0)) {
          local_148.x = 4.0;
        }
        if ((iVar12 < 1) &&
           (local_148.y = (IVar1.y - (pIVar2->DC).CursorPos.y) + local_148.y, local_148.y <= 4.0)) {
          local_148.y = 4.0;
        }
        if ((local_148.x <= 0.0) || (local_148.y <= 0.0)) {
          __assert_fail("size.x > 0.0f && size.y > 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x3c15,
                        "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        this_00->Pos = (this->DC).CursorPos;
        this_00->SizeRef = local_148;
        this_00->Size = local_148;
        uVar10 = (pIVar5->NextWindowData).Flags;
        (pIVar5->NextWindowData).Flags = uVar10 | 1;
        (pIVar5->NextWindowData).PosVal = this_00->Pos;
        (pIVar5->NextWindowData).PosPivotVal.x = 0.0;
        (pIVar5->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar5->NextWindowData).PosCond = 1;
        (pIVar5->NextWindowData).PosUndock = true;
        (pIVar5->NextWindowData).Flags = uVar10 | 3;
        (pIVar5->NextWindowData).SizeVal = this_00->Size;
        (pIVar5->NextWindowData).SizeCond = 1;
        (ctx->NextWindowData).PosUndock = false;
        ImFormatString((char *)&local_138,0x100,"%s/DockSpace_%08X",this->Name,id);
        PushStyleVar(8,0.0);
        Begin((char *)&local_138,(bool *)0x0,0x210001bb);
        PopStyleVar(1);
        pIVar2 = ctx->CurrentWindow;
        pIVar3 = this_00->HostWindow;
        if ((pIVar3 != pIVar2 && pIVar3 != (ImGuiWindow_conflict *)0x0) &&
           (pIVar3->DockNodeAsHost == this_00)) {
          pIVar3->DockNodeAsHost = (ImGuiDockNode *)0x0;
        }
        pIVar2->DockNodeAsHost = this_00;
        this_00->HostWindow = pIVar2;
        node = &local_138;
        IVar8 = ImGuiWindow::GetID(this,(char *)node,(char *)0x0);
        pIVar2->ChildId = IVar8;
        this_00->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        if (this_00->ParentNode != (ImGuiDockNode *)0x0) {
          __assert_fail("node->IsRootNode()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x3c30,
                        "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        if ((this_00->ChildNodes[0] == (ImGuiDockNode *)0x0) &&
           ((this_00->MergedFlags & 0x800) == 0)) {
          uVar10 = this_00->LocalFlags | 0x800;
          this_00->LocalFlags = uVar10;
          this_00->MergedFlags = this_00->SharedFlags | this_00->LocalFlagsInWindows | uVar10;
        }
        DockNodeUpdate((ImGui *)this_00,node);
        End();
        ItemSize(&local_148,-1.0);
      }
      else {
        this_00->LastFrameAlive = iVar11;
      }
    }
  }
  return IVar9;
}

Assistant:

ImGuiID ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return 0;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    IM_ASSERT(id != 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->SetLocalFlags(ImGuiDockNodeFlags_CentralNode);
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_DockSpace);
        return id;
    }
    node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_DockSpace);

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return id;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK: Why do we need a child window to host a dockspace, could we host it in the existing window?
    // FIXME-DOCK: What is the reason for not simply calling BeginChild()? (OK to have a reason but should be commented)
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;
    window_flags |= ImGuiWindowFlags_NoBackground;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();

    ImGuiWindow* host_window = g.CurrentWindow;
    DockNodeSetupHostWindow(node, host_window);
    host_window->ChildId = window->GetID(title);
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());

    // We need to handle the rare case were a central node is missing.
    // This can happen if the node was first created manually with DockBuilderAddNode() but _without_ the ImGuiDockNodeFlags_Dockspace.
    // Doing it correctly would set the _CentralNode flags, which would then propagate according to subsequent split.
    // It would also be ambiguous to attempt to assign a central node while there are split nodes, so we wait until there's a single node remaining.
    // The specific sub-property of _CentralNode we are interested in recovering here is the "Don't delete when empty" property,
    // as it doesn't make sense for an empty dockspace to not have this property.
    if (node->IsLeafNode() && !node->IsCentralNode())
        node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_CentralNode);

    // Update the node
    DockNodeUpdate(node);

    End();
    ItemSize(size);
    return id;
}